

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O0

_Bool observe_kill_diff(wchar_t y,wchar_t x,uint8_t a,wchar_t c)

{
  uint r_idx_00;
  wchar_t wVar1;
  borg_kill *pbVar2;
  borg_kill *kill;
  uint r_idx;
  wchar_t i;
  wchar_t c_local;
  uint8_t a_local;
  wchar_t x_local;
  wchar_t y_local;
  
  r_idx_00 = borg_guess_race(a,c,false,y,x);
  if (r_idx_00 == 0) {
    x_local._3_1_ = false;
  }
  else if (borg.trait[0x78] == 0) {
    wVar1 = borg_new_kill(r_idx_00,y,x);
    pbVar2 = borg_kills + wVar1;
    pbVar2->when = borg_t;
    if (pbVar2->r_idx == borg_morgoth_id) {
      borg_t_morgoth = borg_t;
    }
    x_local._3_1_ = true;
  }
  else {
    x_local._3_1_ = false;
  }
  return x_local._3_1_;
}

Assistant:

bool observe_kill_diff(int y, int x, uint8_t a, wchar_t c)
{
    int          i;
    unsigned int r_idx;

    borg_kill *kill;

    /* Guess the race */
    r_idx = borg_guess_race(a, c, false, y, x);

    /* Oops */
    if (!r_idx)
        return false;

    /* no new monsters if hallucinations */
    if (borg.trait[BI_ISIMAGE])
        return false;

    /* Create a new monster */
    i = borg_new_kill(r_idx, y, x);

    /* Get the object */
    kill = &borg_kills[i];

    /* Timestamp */
    kill->when = borg_t;

    /* Mark the Morgoth time stamp if needed */
    if (kill->r_idx == borg_morgoth_id)
        borg_t_morgoth = borg_t;

    /* Done */
    return true;
}